

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QTextEdit::ExtraSelection>::Inserter::insertOne
          (Inserter *this,qsizetype pos,ExtraSelection *t)

{
  ExtraSelection *this_00;
  qsizetype i;
  long lVar1;
  long lVar2;
  
  setup(this,pos,1);
  this_00 = this->end;
  if (this->sourceCopyConstruct != 0) {
    QTextEdit::ExtraSelection::ExtraSelection(this_00,t);
    this->size = this->size + 1;
    return;
  }
  QTextEdit::ExtraSelection::ExtraSelection(this_00,this_00 + -1);
  this->size = this->size + 1;
  lVar2 = 0;
  for (lVar1 = 0; lVar1 != this->move; lVar1 = lVar1 + -1) {
    QTextEdit::ExtraSelection::operator=
              ((ExtraSelection *)(&this->last->cursor + lVar2),
               (ExtraSelection *)(&this->last[-1].cursor + lVar2));
    lVar2 = lVar2 + -0x18;
  }
  QTextEdit::ExtraSelection::operator=(this->where,t);
  return;
}

Assistant:

void insertOne(qsizetype pos, T &&t)
        {
            setup(pos, 1);

            if (sourceCopyConstruct) {
                Q_ASSERT(sourceCopyConstruct == 1);
                new (end) T(std::move(t));
                ++size;
            } else {
                // create a new element at the end by move constructing one existing element
                // inside the array.
                new (end) T(std::move(*(end - 1)));
                ++size;

                // now move assign existing elements towards the end
                for (qsizetype i = 0; i != move; --i)
                    last[i] = std::move(last[i - 1]);

                // and move the new item into place
                *where = std::move(t);
            }
        }